

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O2

void __thiscall
cnn::Model::save<boost::archive::text_oarchive>(Model *this,text_oarchive *ar,uint param_2)

{
  pointer ppPVar1;
  pointer ppLVar2;
  uint uVar3;
  int nlp;
  int np;
  int local_20;
  int local_1c;
  
  local_1c = (int)((ulong)((long)(this->params).
                                 super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->params).
                                super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_20 = (int)((ulong)((long)(this->lookup_params).
                                 super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->lookup_params).
                                super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
  boost::archive::save_access::save_primitive<boost::archive::text_oarchive,int>(ar,&local_1c);
  boost::archive::save_access::save_primitive<boost::archive::text_oarchive,int>(ar,&local_20);
  uVar3 = 0;
  while( true ) {
    ppPVar1 = (this->params).
              super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->params).
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3) <=
        (ulong)uVar3) break;
    boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
    invoke<cnn::Parameters>(ar,ppPVar1[uVar3]);
    uVar3 = uVar3 + 1;
  }
  uVar3 = 0;
  while( true ) {
    ppLVar2 = (this->lookup_params).
              super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->lookup_params).
                      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3) <=
        (ulong)uVar3) break;
    boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
    invoke<cnn::LookupParameters>(ar,ppLVar2[uVar3]);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void save(Archive& ar, const unsigned int) const {
    int np = params.size();
    int nlp = lookup_params.size();
    ar & np;
    ar & nlp;
    for (unsigned i = 0; i < params.size(); ++i)
      ar & *params[i];
    for (unsigned i = 0; i < lookup_params.size(); ++i)
      ar & *lookup_params[i];
  }